

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ptr_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::RawPtr_Basic_Test::~RawPtr_Basic_Test
          (RawPtr_Basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RawPtr, Basic) {
  RawPtr<Obj> raw;
  EXPECT_EQ(raw->i, 0);
  EXPECT_EQ((*raw).i, 0);
  EXPECT_EQ(static_cast<void*>(&raw->i), kZeroBuffer);
  EXPECT_EQ(static_cast<void*>(raw.Get()), kZeroBuffer);
  EXPECT_TRUE(raw.IsDefault());

  Obj obj = {1};
  raw.Set(&obj);
  EXPECT_EQ(raw->i, 1);
  EXPECT_EQ(static_cast<void*>(raw.Get()), &obj);
  EXPECT_FALSE(raw.IsDefault());
}